

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O0

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,t2<char,_int> *Val)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  anon_union_8_2_2df48d06_for_stref_0 local_50;
  undefined4 local_48;
  int local_3c;
  t2<char,_int> *ptStack_38;
  int I;
  t2<char,_int> *Val_local;
  cstr Opt_local;
  cstr *Args_local;
  int NArgs_local;
  anon_union_8_2_2df48d06_for_stref_0 *local_10;
  
  local_3c = 1;
  ptStack_38 = Val;
  Val_local = (t2<char,_int> *)Opt;
  Opt_local = (cstr)Args;
  Args_local._0_4_ = NArgs;
  while( true ) {
    if ((int)Args_local <= local_3c + 2) {
      return false;
    }
    iVar2 = strncmp(*(char **)(Opt_local + (long)local_3c * 8),&Val_local->First,0x20);
    if (iVar2 == 0) break;
    local_3c = local_3c + 1;
  }
  ptStack_38->First = **(char **)(Opt_local + (long)(local_3c + 1) * 8);
  _NArgs_local = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Opt_local + (long)(local_3c + 2) * 8))->
                 Ptr;
  local_10 = &local_50;
  local_50 = _NArgs_local;
  sVar3 = strlen(_NArgs_local);
  local_48 = (undefined4)sVar3;
  bVar1 = ToInt((stref *)&local_50,&ptStack_38->Second);
  return bVar1;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, t2<char, int>* Val)
{
  for (int I = 1; I + 2 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      Val->First = Args[I + 1][0];
      return ToInt(Args[I + 2], &Val->Second);
    }
  }

  return false;
}